

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

void aom_denoise_and_model_free(aom_denoise_and_model_t *ctx)

{
  int i;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar1;
  
  aom_free((void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
    aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  }
  aom_noise_model_free((aom_noise_model_t *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  aom_flat_block_finder_free((aom_flat_block_finder_t *)0x3c7dca);
  aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void aom_denoise_and_model_free(struct aom_denoise_and_model_t *ctx) {
  aom_free(ctx->flat_blocks);
  for (int i = 0; i < 3; ++i) {
    aom_free(ctx->denoised[i]);
    aom_free(ctx->noise_psd[i]);
  }
  aom_noise_model_free(&ctx->noise_model);
  aom_flat_block_finder_free(&ctx->flat_block_finder);
  aom_free(ctx);
}